

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WOZ.cpp
# Opt level: O1

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::WOZ::get_track_at_position(WOZ *this,Address address)

{
  FileHolder *this_00;
  uint16_t uVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  long lVar5;
  size_t in_RCX;
  Address in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  size_t number_of_bits;
  Time source;
  shared_ptr<Storage::Disk::Track> sVar7;
  undefined1 local_a1;
  pthread_mutex_t *local_a0;
  DiskImage local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  undefined1 local_88 [72];
  __gid_t local_40;
  _Bit_pointer local_38;
  
  lVar5 = file_offset((WOZ *)address,in_RDX);
  if (lVar5 == 0) {
    (this->super_DiskImage)._vptr_DiskImage = (_func_int **)0x0;
    (this->file_).file_ = (FILE *)0x0;
    _Var6._M_pi = extraout_RDX;
  }
  else {
    this_00 = (FileHolder *)((long)address + 8);
    local_a0 = (pthread_mutex_t *)FileHolder::get_file_access_mutex(this_00);
    iVar2 = pthread_mutex_lock(local_a0);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    FileHolder::seek(this_00,lVar5,0);
    if (*(int *)((long)address + 0xf0) == 0) {
      FileHolder::read((FileHolder *)local_88,(int)this_00,(void *)0x19f6,in_RCX);
      lVar5 = CONCAT44(local_88._20_4_,local_88._16_4_);
      FileHolder::seek(this_00,2,1);
      uVar1 = FileHolder::get16le(this_00);
      uVar4 = (uint)uVar1;
      if (0xcfaf < uVar1) {
        uVar4 = 0xcfb0;
      }
      number_of_bits = (size_t)uVar4;
      source = (Time)local_88._0_8_;
    }
    else {
      uVar1 = FileHolder::get16le(this_00);
      FileHolder::seek(this_00,2,1);
      uVar3 = FileHolder::get32le(this_00);
      FileHolder::seek(this_00,(ulong)uVar1 << 9,0);
      number_of_bits = (size_t)uVar3;
      FileHolder::read((FileHolder *)local_88,(int)this_00,(void *)(number_of_bits + 7 >> 3),in_RCX)
      ;
      lVar5 = CONCAT44(local_88._20_4_,local_88._16_4_);
      source = (Time)local_88._0_8_;
    }
    pthread_mutex_unlock(local_a0);
    PCMSegment::PCMSegment((PCMSegment *)local_88,number_of_bits,(uint8_t *)source);
    local_98._vptr_DiskImage = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::PCMTrack,std::allocator<Storage::Disk::PCMTrack>,Storage::Disk::PCMSegment>
              (&local_90,(PCMTrack **)&local_98,(allocator<Storage::Disk::PCMTrack> *)&local_a1,
               (PCMSegment *)local_88);
    _Var6._M_pi = local_90._M_pi;
    (this->super_DiskImage)._vptr_DiskImage = local_98._vptr_DiskImage;
    (this->file_).file_ = (FILE *)0x0;
    local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->file_).file_ = (FILE *)_Var6._M_pi;
    local_98._vptr_DiskImage = (_func_int **)0x0;
    _Var6._M_pi = extraout_RDX_00;
    if ((_Bit_type *)local_88._48_8_ != (_Bit_type *)0x0) {
      operator_delete((void *)local_88._48_8_,(long)local_38 - local_88._48_8_);
      local_88._48_8_ = (_Bit_type *)0x0;
      local_88._56_4_ = 0;
      local_88._64_8_ = (_Bit_type *)0x0;
      local_40 = 0;
      local_38 = (_Bit_pointer)0x0;
      _Var6._M_pi = extraout_RDX_01;
    }
    if ((pointer)local_88._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_88._8_8_,local_88._40_8_ - local_88._8_8_);
      local_88._8_8_ = (pointer)0x0;
      local_88._16_4_ = 0;
      local_88._24_8_ = 0;
      local_88._32_4_ = 0;
      local_88._40_8_ = (_Bit_pointer)0x0;
      _Var6._M_pi = extraout_RDX_02;
    }
    if (source != (Time)0x0) {
      operator_delete((void *)source,lVar5 - (long)source);
      _Var6._M_pi = extraout_RDX_03;
    }
  }
  sVar7.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar7.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar7.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Track> WOZ::get_track_at_position(Track::Address address) {
	const long offset = file_offset(address);
	if(offset == NoSuchTrack) {
		return nullptr;
	}

	// Seek to the real track.
	std::vector<uint8_t> track_contents;
	size_t number_of_bits;
	{
		std::lock_guard lock_guard(file_.get_file_access_mutex());
		file_.seek(offset, SEEK_SET);

		switch(type_) {
			case Type::WOZ1:
				// In WOZ 1, a track is up to 6646 bytes of data, followed by a two-byte record of the
				// number of bytes that actually had data in them, then a two-byte count of the number
				// of bits that were used. Other information follows but is not intended for emulation.
				track_contents = file_.read(6646);
				file_.seek(2, SEEK_CUR);
				number_of_bits = std::min(file_.get16le(), uint16_t(6646*8));
			break;

			default:
			case Type::WOZ2: {
				// In WOZ 2 an extra level of indirection allows for variable track sizes.
				const uint16_t starting_block = file_.get16le();
				file_.seek(2, SEEK_CUR);	// Skip the block count; the amount of data to read is implied by the number of bits.
				number_of_bits = file_.get32le();

				file_.seek(starting_block * 512, SEEK_SET);
				track_contents = file_.read((number_of_bits + 7) >> 3);
			} break;
		}
	}

	return std::make_shared<PCMTrack>(PCMSegment(number_of_bits, track_contents));
}